

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCArray NULLC::ShortToStr(short *r)

{
  char *pcVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  short sVar9;
  NULLCArray NVar10;
  char buf [16];
  char local_28;
  char local_27 [15];
  
  if (r == (short *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar10 = (NULLCArray)ZEXT812(0);
  }
  else {
    sVar2 = *r;
    iVar3 = (int)sVar2;
    sVar4 = sVar2 % 10;
    sVar5 = -sVar4;
    if (0 < sVar4) {
      sVar5 = sVar4;
    }
    local_28 = (char)sVar5 + '0';
    pcVar6 = local_27;
    pcVar7 = &local_28;
    sVar5 = sVar2;
    while (pcVar1 = pcVar6, 0x12 < (ushort)(sVar5 + 9U)) {
      sVar4 = (short)iVar3;
      iVar3 = (int)sVar4 >> 0x1f;
      iVar8 = (int)sVar4 / 10 + iVar3;
      iVar3 = iVar8 - iVar3;
      sVar5 = (short)((uint)(iVar3 * 0x6667) >> 0x10);
      sVar9 = (short)iVar3 + ((sVar5 >> 2) - (sVar5 >> 0xf)) * -10;
      sVar5 = -sVar9;
      if (0 < sVar9) {
        sVar5 = sVar9;
      }
      *pcVar1 = (char)sVar5 + '0';
      pcVar6 = pcVar1 + 1;
      pcVar7 = pcVar1;
      sVar5 = (short)iVar8 - (sVar4 >> 0xf);
    }
    pcVar6 = pcVar1;
    if (sVar2 < 0) {
      pcVar6 = pcVar7 + 2;
      *pcVar1 = '-';
    }
    NVar10 = AllocArray(1,((int)pcVar6 - (int)&local_28) + 1,2);
    pcVar7 = NVar10.ptr;
    do {
      pcVar1 = pcVar6 + -1;
      pcVar6 = pcVar6 + -1;
      *pcVar7 = *pcVar1;
      pcVar7 = pcVar7 + 1;
    } while (pcVar6 != &local_28);
  }
  return NVar10;
}

Assistant:

NULLCArray NULLC::ShortToStr(short* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	short number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}